

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<14,_12,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Matrix<float,_3,_4> *mat;
  long lVar6;
  undefined8 *puVar7;
  undefined4 uVar8;
  Vector<float,_3> res_3;
  Vector<float,_3> res;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Type in0;
  Vector<float,_3> res_1;
  float afStack_b8 [6];
  Vec4 *local_a0;
  ulong local_98;
  undefined4 local_90;
  float local_88 [4];
  float local_78 [4];
  undefined8 local_68;
  float fStack_60;
  float afStack_5c [3];
  undefined8 uStack_50;
  float local_48;
  float afStack_44 [3];
  Matrix<float,_3,_4> local_38;
  
  puVar2 = &local_68;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar6) = uVar8;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x30);
      lVar5 = lVar5 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_68 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_60 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    afStack_5c[0] = (float)uVar1;
    afStack_5c[1] = (float)((ulong)uVar1 >> 0x20);
    afStack_5c[2] = evalCtx->in[1].m_data[2];
    uStack_50 = *(undefined8 *)evalCtx->in[2].m_data;
    local_48 = evalCtx->in[2].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[3].m_data;
    afStack_44[0] = (float)uVar1;
    afStack_44[1] = (float)((ulong)uVar1 >> 0x20);
    afStack_44[2] = evalCtx->in[3].m_data[2];
    mat = (Matrix<float,_3,_4> *)0x3;
  }
  else {
    local_48 = 0.0;
    afStack_44[0] = 0.0;
    afStack_44[1] = 0.0;
    afStack_44[2] = 0.0;
    afStack_5c[1] = 0.0;
    afStack_5c[2] = 0.0;
    uStack_50 = 0;
    local_68 = 0;
    fStack_60 = 0.0;
    afStack_5c[0] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x3;
    mat = (Matrix<float,_3,_4> *)0x0;
    do {
      lVar3 = 0;
      puVar7 = puVar2;
      do {
        *(undefined4 *)puVar7 = puVar4[lVar3];
        lVar3 = lVar3 + 1;
        puVar7 = (undefined8 *)((long)puVar7 + 0xc);
      } while (lVar3 != 4);
      mat = (Matrix<float,_3,_4> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar4 = puVar4 + 4;
    } while (mat != (Matrix<float,_3,_4> *)0x3);
  }
  local_98 = local_98 & 0xffffffff00000000;
  local_a0 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_a0 + lVar3 * 4) =
         *(float *)((long)&local_68 + lVar3 * 4) + afStack_5c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_38.m_data.m_data[0].m_data[2] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    local_38.m_data.m_data[0].m_data[lVar3] =
         *(float *)((long)&local_a0 + lVar3 * 4) + *(float *)((long)&uStack_50 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_78[2] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  lVar3 = 0;
  do {
    local_78[lVar3] = local_38.m_data.m_data[0].m_data[lVar3] + afStack_44[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,3,4>
            (&local_38,(MatrixCaseUtils *)&local_68,mat);
  afStack_b8[4] = 0.0;
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_b8[lVar3 + 2] =
         local_38.m_data.m_data[0].m_data[lVar3] + local_38.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_98 = local_98 & 0xffffffff00000000;
  local_a0 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    *(float *)((long)&local_a0 + lVar3 * 4) =
         afStack_b8[lVar3 + 2] + local_38.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_88[2] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  lVar3 = 0;
  do {
    local_88[lVar3] =
         *(float *)((long)&local_a0 + lVar3 * 4) + local_38.m_data.m_data[3].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  afStack_b8[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_b8[lVar3 + 2] = local_78[lVar3] + local_88[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a0 = &evalCtx->color;
  local_98 = 0x100000000;
  local_90 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_a0 + lVar3 * 4)] = afStack_b8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(decrement(in0));
	}